

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static_test.cpp
# Opt level: O0

void dumpinfo<multidim::MultiDimNView<double,multidim::type_sequence<multidim::sspair<5,336>,multidim::sspair<6,56>,multidim::sspair<8,1>>>>
               (MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                *x,char *name)

{
  int iVar1;
  ostream *poVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  char *name_local;
  MultiDimNView<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
  *x_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,name);
  poVar2 = std::operator<<(poVar2," has ndims:");
  iVar1 = multidim::
          MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
          ::ndims((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                   *)x);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," numel:");
  iVar1 = multidim::
          MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
          ::numel((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                   *)x);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout," sizes: ");
  local_1c = 0;
  while( true ) {
    iVar1 = multidim::
            MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
            ::ndims((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                     *)x);
    if (iVar1 <= local_1c) break;
    iVar1 = multidim::
            MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
            ::getsize((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                       *)x,local_1c);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
    local_1c = local_1c + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout," steps: ");
  local_20 = 0;
  while( true ) {
    iVar1 = multidim::
            MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
            ::ndims((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                     *)x);
    if (iVar1 <= local_20) break;
    iVar1 = multidim::
            MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
            ::getstep((MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<8,_1>_>_>
                       *)x,local_20);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2," ");
    local_20 = local_20 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void dumpinfo(const T& x,const char * name)
{
	std::cout << name << " has ndims:" << x.ndims() << " numel:" << x.numel() << std::endl;
	std::cout << " sizes: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getsize(i) << " ";
	}
	std::cout << std::endl;
	std::cout << " steps: ";
	for(int i = 0; i < x.ndims(); i++)
	{
		std::cout << x.getstep(i) << " ";
	}
	std::cout << std::endl;
}